

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall
QListWidgetPrivate::emitItemDoubleClicked(QListWidgetPrivate *this,QModelIndex *index)

{
  QListWidget *this_00;
  QListModel *pQVar1;
  QListWidgetItem *_t1;
  
  this_00 = *(QListWidget **)
             &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar1 = listModel(this);
  if ((ulong)(long)index->r < (ulong)(pQVar1->items).d.size) {
    _t1 = (pQVar1->items).d.ptr[index->r];
  }
  else {
    _t1 = (QListWidgetItem *)0x0;
  }
  QListWidget::itemDoubleClicked(this_00,_t1);
  return;
}

Assistant:

void QListWidgetPrivate::emitItemDoubleClicked(const QModelIndex &index)
{
    Q_Q(QListWidget);
    emit q->itemDoubleClicked(listModel()->at(index.row()));
}